

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O0

void __thiscall
QOpenGLShaderProgram::setUniformValue(QOpenGLShaderProgram *this,char *name,QSize *size)

{
  QSize *in_RDX;
  QOpenGLShaderProgram *in_RSI;
  QOpenGLShaderProgram *in_RDI;
  
  uniformLocation(in_RSI,(char *)in_RDX);
  setUniformValue(in_RDI,(int)((ulong)in_RSI >> 0x20),in_RDX);
  return;
}

Assistant:

void QOpenGLShaderProgram::setUniformValue(const char *name, const QSize& size)
{
    setUniformValue(uniformLocation(name), size);
}